

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::StartEmitFunction(ByteCodeGenerator *this,ParseNodeFnc *pnodeFnc)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  anon_class_24_3_8900e8ef fn;
  anon_class_24_3_c793ac44 fn_00;
  anon_class_24_3_c793ac44 fn_01;
  anon_class_32_4_532d1dbc fn_02;
  anon_class_16_2_85211fcd fn_03;
  anon_class_16_2_85211fcd fn_04;
  anon_class_16_2_85211fcd fn_05;
  anon_class_16_2_85211fcd fn_06;
  bool bVar4;
  SymbolType SVar5;
  bool bVar6;
  LocalFunctionId LVar7;
  RegSlot RVar8;
  uint uVar9;
  uint32 uVar10;
  undefined4 *puVar11;
  FunctionBody *pFVar12;
  ByteBlock *pBVar13;
  ScriptContext *this_00;
  ThreadContext *this_01;
  ParseNodeVar *pPVar14;
  CharacterBuffer<char16_t> *pCVar15;
  Scope *pSVar16;
  byte local_189;
  ParseNodeBlock *paramBlock;
  bool newScopeForEval;
  anon_class_24_3_c793ac44 ensureScopeSlot;
  Symbol *local_118;
  Symbol *sym_2;
  ParseNode *pnode_1;
  ByteCodeGenerator *local_100;
  ByteCodeGenerator *local_f8;
  ParseNode *local_f0;
  anon_class_24_3_8900e8ef ensureFncDeclScopeSlots;
  anon_class_32_4_532d1dbc moveArgToReg;
  undefined1 local_80 [6];
  ArgSlot pos;
  Symbol *formal;
  FuncInfo **local_70;
  ByteCodeGenerator *local_68;
  FuncInfo **local_60;
  Symbol *local_58;
  Symbol *sym_1;
  ParseNode *pnode;
  Symbol *funcSym;
  Symbol *sym;
  Scope *funcExprScope;
  Scope *paramScope;
  Scope *bodyScope;
  FuncInfo *funcInfo;
  ParseNodeFnc *pnodeFnc_local;
  ByteCodeGenerator *this_local;
  
  funcInfo = (FuncInfo *)pnodeFnc;
  pnodeFnc_local = (ParseNodeFnc *)this;
  if (((pnodeFnc->super_ParseNode).nop != knopFncDecl) &&
     ((pnodeFnc->super_ParseNode).nop != knopProg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xdb5,"(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg)",
                       "pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bodyScope = (Scope *)funcInfo->name;
  paramScope = FuncInfo::GetBodyScope((FuncInfo *)bodyScope);
  funcExprScope = FuncInfo::GetParamScope((FuncInfo *)bodyScope);
  bVar4 = Js::ParseableFunctionInfo::IsFunctionParsed
                    (*(ParseableFunctionInfo **)&bodyScope[6].scopeType);
  if ((!bVar4) || (*(long *)(*(long *)&bodyScope[6].scopeSlotCount + 0x58) == 0)) goto LAB_00b3fe8a;
  pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)bodyScope);
  pBVar13 = Js::FunctionBody::GetByteCode(pFVar12);
  if ((pBVar13 == (ByteBlock *)0x0) && ((this->flags & 0x404) == 0)) {
    pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)bodyScope);
    Js::FunctionBody::SetEnvDepth(pFVar12,this->envDepth);
  }
  bVar4 = FuncInfo::GetCallsEval((FuncInfo *)bodyScope);
  if (bVar4) {
    Js::ParseableFunctionInfo::SetDontInline
              (*(ParseableFunctionInfo **)&bodyScope[6].scopeType,true);
  }
  sym = (Symbol *)bodyScope[6].alloc;
  if (sym != (Symbol *)0x0) {
    bVar4 = FuncInfo::GetCallsEval((FuncInfo *)bodyScope);
    if ((bVar4) && (bVar4 = Scope::GetIsObject((Scope *)sym), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xdcd,"(funcExprScope->GetIsObject())","funcExprScope->GetIsObject()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    bVar4 = Scope::GetIsObject((Scope *)sym);
    if (bVar4) {
      Scope::SetCapturesAll((Scope *)sym,true);
      Scope::SetMustInstantiate((Scope *)sym,true);
      PushScope(this,(Scope *)sym);
    }
    else {
      funcSym = ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&bodyScope[6].scopeSlotCount);
      bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)bodyScope);
      if (bVar4) {
        Scope::AddSymbol(*(Scope **)&bodyScope[6].m_count,funcSym);
      }
      else {
        Scope::AddSymbol((Scope *)bodyScope[6].m_symList,funcSym);
      }
      Symbol::EnsureScopeSlot(funcSym,this,(FuncInfo *)bodyScope);
      bVar4 = Symbol::GetHasNonLocalReference(funcSym);
      if (bVar4) {
        pSVar16 = Symbol::GetScope(funcSym);
        Scope::SetHasOwnLocalInClosure(pSVar16,true);
      }
    }
  }
  if ((char)funcInfo->inlineCacheCount == 'W') {
    bVar6 = Js::ParseableFunctionInfo::GetIsStrictMode
                      (*(ParseableFunctionInfo **)&bodyScope[6].scopeType);
    bVar4 = false;
    if (bVar6) {
      uVar10 = GetFlags(this);
      bVar4 = (uVar10 & 0x400) != 0;
    }
    if ((bVar4) && (bVar4 = Scope::GetIsObject(paramScope), !bVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xef6,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    goto LAB_00b3fe8a;
  }
  bVar4 = Scope::GetIsObject(paramScope);
  if (((!bVar4) &&
      (bVar4 = NeedObjectAsFunctionScope(this,(FuncInfo *)bodyScope,(ParseNodeFnc *)funcInfo), bVar4
      )) && (bVar4 = Scope::GetIsObject(paramScope), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xded,"(bodyScope->GetIsObject())","bodyScope->GetIsObject()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar4 = Scope::GetIsObject(paramScope);
  if (bVar4) {
    Scope::SetLocation(paramScope,bodyScope[1].scopeType);
  }
  else {
    Scope::SetLocation(paramScope,*(RegSlot *)&bodyScope[1].field_0x44);
  }
  bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)bodyScope);
  if (!bVar4) {
    bVar4 = Scope::GetIsObject(funcExprScope);
    if (bVar4) {
      Scope::SetLocation(funcExprScope,bodyScope[1].scopeType);
    }
    else {
      Scope::SetLocation(funcExprScope,*(RegSlot *)&bodyScope[1].field_0x44);
    }
  }
  bVar4 = Scope::GetIsObject(paramScope);
  pSVar16 = bodyScope;
  if (bVar4) {
    uVar9 = Js::FunctionProxy::GetSourceContextId(*(FunctionProxy **)&bodyScope[6].scopeType);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId(*(FunctionProxy **)&bodyScope[6].scopeType);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,CachedScopePhase,uVar9,LVar7);
    local_189 = 0;
    if (!bVar4) {
      bVar4 = FuncInfo::Escapes((FuncInfo *)bodyScope);
      local_189 = 0;
      if ((!bVar4) && (local_189 = 0, bodyScope[1].scopeType != ~ScopeType_Unknown)) {
        bVar4 = ApplyEnclosesArgs((ParseNode *)funcInfo,this);
        local_189 = 0;
        if (!bVar4) {
          bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)bodyScope);
          local_189 = 0;
          if (bVar4) {
            bVar4 = ParseNodeFnc::HasDefaultArguments((ParseNodeFnc *)funcInfo);
            local_189 = 0;
            if (!bVar4) {
              bVar4 = ParseNodeFnc::HasDestructuredParams((ParseNodeFnc *)funcInfo);
              local_189 = 0;
              if (!bVar4) {
                uVar9 = Js::FunctionProxy::GetSourceContextId
                                  (*(FunctionProxy **)&bodyScope[6].scopeType);
                LVar7 = Js::FunctionProxy::GetLocalFunctionId
                                  (*(FunctionProxy **)&bodyScope[6].scopeType);
                bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,CachedScopePhase,uVar9,LVar7);
                if (!bVar4) {
                  bVar4 = IsInDebugMode(this);
                  local_189 = 0;
                  if (bVar4) goto LAB_00b3f37d;
                }
                pFVar12 = FuncInfo::GetParsedFunctionBody((FuncInfo *)bodyScope);
                this_00 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)pFVar12);
                this_01 = Js::ScriptContext::GetThreadContext(this_00);
                bVar4 = ThreadContext::IsRuntimeInTTDMode(this_01);
                local_189 = 0;
                if (!bVar4) {
                  bVar4 = Js::FunctionProxy::IsCoroutine(*(FunctionProxy **)&bodyScope[6].scopeType)
                  ;
                  local_189 = bVar4 ^ 0xff;
                }
              }
            }
          }
        }
      }
    }
LAB_00b3f37d:
    FuncInfo::SetHasCachedScope((FuncInfo *)pSVar16,(bool)(local_189 & 1));
    bVar4 = FuncInfo::GetHasCachedScope((FuncInfo *)bodyScope);
    if (bVar4) {
      if (*(int *)&bodyScope[2].scopeInfo != -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xe19,"(funcInfo->funcObjRegister == Js::Constants::NoRegister)",
                           "funcInfo->funcObjRegister == Js::Constants::NoRegister");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      pnode = (ParseNode *)
              ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&bodyScope[6].scopeSlotCount);
      if (((Symbol *)pnode == (Symbol *)0x0) ||
         (bVar4 = Symbol::GetIsFuncExpr((Symbol *)pnode), !bVar4)) {
        RVar8 = FuncInfo::NextVarRegister((FuncInfo *)bodyScope);
        *(RegSlot *)&bodyScope[2].scopeInfo = RVar8;
      }
      else {
        RVar8 = Symbol::GetLocation((Symbol *)pnode);
        if (RVar8 == 0xffffffff) {
          RVar8 = FuncInfo::NextVarRegister((FuncInfo *)bodyScope);
          *(RegSlot *)&bodyScope[2].scopeInfo = RVar8;
        }
        else {
          RVar8 = Symbol::GetLocation((Symbol *)pnode);
          *(RegSlot *)&bodyScope[2].scopeInfo = RVar8;
        }
      }
      if (*(int *)&bodyScope[2].scopeInfo == -1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xe2a,"(funcInfo->funcObjRegister != Js::Constants::NoRegister)",
                           "funcInfo->funcObjRegister != Js::Constants::NoRegister");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
    }
    bVar4 = FuncInfo::GetHasArguments((FuncInfo *)bodyScope);
    if (bVar4) {
      local_60 = (FuncInfo **)&bodyScope;
      fn_06.funcInfo = local_60;
      fn_06.this = this;
      local_68 = this;
      MapFormals<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__0>
                ((ParseNodeFnc *)funcInfo,fn_06);
      local_70 = (FuncInfo **)&bodyScope;
      fn_05.funcInfo = local_70;
      fn_05.this = this;
      formal = (Symbol *)this;
      MapFormalsFromPattern<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__1>
                ((ParseNodeFnc *)funcInfo,fn_05);
      local_58 = FuncInfo::GetArgumentsSymbol((FuncInfo *)bodyScope);
      if (local_58 == (Symbol *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xe41,"(sym)","sym");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      bVar4 = Symbol::NeedsSlotAlloc(local_58,this,(FuncInfo *)bodyScope);
      if (bVar4) {
        Symbol::EnsureScopeSlot(local_58,this,(FuncInfo *)bodyScope);
      }
    }
    local_58 = ParseNodeFnc::GetFuncSymbol(*(ParseNodeFnc **)&bodyScope[6].scopeSlotCount);
    if ((local_58 != (Symbol *)0x0) &&
       (bVar4 = Symbol::NeedsSlotAlloc(local_58,this,(FuncInfo *)bodyScope), bVar4)) {
      if ((bodyScope[6].alloc == (ArenaAllocator *)0x0) ||
         (bVar4 = Scope::GetIsObject((Scope *)bodyScope[6].alloc), !bVar4)) {
        bVar4 = FuncInfo::GetFuncExprNameReference((FuncInfo *)bodyScope);
        if (bVar4) {
          Symbol::EnsureScopeSlot(local_58,this,(FuncInfo *)bodyScope);
        }
      }
      else {
        Symbol::SetScopeSlot(local_58,0);
      }
    }
    bVar4 = FuncInfo::GetHasArguments((FuncInfo *)bodyScope);
    if (!bVar4) {
      moveArgToReg.funcInfo._6_2_ = 1;
      moveArgToReg.formal = (Symbol **)((long)&moveArgToReg.funcInfo + 6);
      moveArgToReg.this = (ByteCodeGenerator *)&bodyScope;
      fn_02.pos = (ArgSlot *)moveArgToReg.formal;
      fn_02.formal = (Symbol **)local_80;
      fn_02.this = this;
      fn_02.funcInfo = (FuncInfo **)moveArgToReg.this;
      moveArgToReg.pos = (ArgSlot *)this;
      MapFormals<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__2>
                ((ParseNodeFnc *)funcInfo,fn_02);
      fn_04.funcInfo = (FuncInfo **)&bodyScope;
      fn_04.this = this;
      ensureFncDeclScopeSlots.funcInfo = (FuncInfo **)this;
      MapFormalsFromPattern<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__3>
                ((ParseNodeFnc *)funcInfo,fn_04);
    }
    sym_1 = *(Symbol **)&funcInfo->inArgsCount;
    while (sym_1 != (Symbol *)0x0) {
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
      local_58 = pPVar14->sym;
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
      if ((pPVar14->isBlockScopeFncDeclVar == '\0') ||
         (bVar4 = Symbol::GetIsBlockVar(local_58), !bVar4)) {
        bVar4 = Symbol::GetIsCatch(local_58);
        if ((bVar4) ||
           ((*(char *)&(sym_1->name).string.ptr == 'Q' &&
            (bVar4 = Symbol::GetIsBlockVar(local_58), bVar4)))) {
          pSVar16 = *(Scope **)&bodyScope[6].m_count;
          pCVar15 = Symbol::GetName(local_58);
          local_58 = Scope::FindLocalSymbol(pSVar16,pCVar15);
        }
        SVar5 = Symbol::GetSymbolType(local_58);
        if ((SVar5 == STVariable) && (bVar4 = Symbol::IsArguments(local_58), !bVar4)) {
          Symbol::EnsureScopeSlot(local_58,this,(FuncInfo *)bodyScope);
        }
      }
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_1);
      sym_1 = (Symbol *)pPVar14->pnodeNext;
    }
    pnode_1 = (ParseNode *)&sym_1;
    local_f8 = (ByteCodeGenerator *)&bodyScope;
    fn.this = this;
    fn.pnode = (ParseNode **)pnode_1;
    fn.funcInfo = (FuncInfo **)local_f8;
    local_100 = this;
    local_f0 = pnode_1;
    ensureFncDeclScopeSlots.pnode = (ParseNode **)this;
    ensureFncDeclScopeSlots.this = local_f8;
    ParseNodeFnc::MapContainerScopes<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__4>
              ((ParseNodeFnc *)funcInfo,fn);
    lVar2._0_4_ = funcInfo->outArgsCurrentExpr;
    lVar2._4_4_ = funcInfo->innerScopeCount;
    if (lVar2 != 0) {
      if (**(char **)&funcInfo->nextForInLoopLevel != 'b') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xe98,"(pnodeFnc->pnodeScopes->nop == knopBlock)",
                           "pnodeFnc->pnodeScopes->nop == knopBlock");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      EnsureLetConstScopeSlots(this,(ParseNodeBlock *)funcInfo->alloc,(FuncInfo *)bodyScope);
    }
  }
  else {
    fn_03.funcInfo = (FuncInfo **)&bodyScope;
    fn_03.this = this;
    ParseNodeFnc::MapContainerScopes<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__5>
              ((ParseNodeFnc *)funcInfo,fn_03);
    sym_2 = *(Symbol **)&funcInfo->inArgsCount;
    while (sym_2 != (Symbol *)0x0) {
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_2);
      local_118 = pPVar14->sym;
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_2);
      if ((pPVar14->isBlockScopeFncDeclVar == '\0') ||
         (bVar4 = Symbol::GetIsBlockVar(local_118), !bVar4)) {
        bVar4 = Symbol::GetIsCatch(local_118);
        if ((bVar4) ||
           ((*(char *)&(sym_2->name).string.ptr == 'Q' &&
            (bVar4 = Symbol::GetIsBlockVar(local_118), bVar4)))) {
          pSVar16 = *(Scope **)&bodyScope[6].m_count;
          pCVar15 = Symbol::GetName(local_118);
          local_118 = Scope::FindLocalSymbol(pSVar16,pCVar15);
        }
        SVar5 = Symbol::GetSymbolType(local_118);
        if (((SVar5 == STVariable) &&
            (bVar4 = Symbol::NeedsSlotAlloc(local_118,this,(FuncInfo *)bodyScope), bVar4)) &&
           (bVar4 = Symbol::IsArguments(local_118), !bVar4)) {
          Symbol::EnsureScopeSlot(local_118,this,(FuncInfo *)bodyScope);
        }
      }
      pPVar14 = ParseNode::AsParseNodeVar((ParseNode *)sym_2);
      sym_2 = (Symbol *)pPVar14->pnodeNext;
    }
    fn_00.this = this;
    fn_00.sym = &local_118;
    fn_00.funcInfo = (FuncInfo **)&bodyScope;
    MapFormals<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
              ((ParseNodeFnc *)funcInfo,fn_00);
    fn_01.this = this;
    fn_01.sym = &local_118;
    fn_01.funcInfo = (FuncInfo **)&bodyScope;
    MapFormalsFromPattern<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
              ((ParseNodeFnc *)funcInfo,fn_01);
    bVar4 = FuncInfo::GetHasArguments((FuncInfo *)bodyScope);
    if (bVar4) {
      local_118 = FuncInfo::GetArgumentsSymbol((FuncInfo *)bodyScope);
      if (local_118 == (Symbol *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0xec5,"(sym)","sym");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      Symbol::EnsureScopeSlot(local_118,this,(FuncInfo *)bodyScope);
    }
    lVar1._0_4_ = funcInfo->outArgsCurrentExpr;
    lVar1._4_4_ = funcInfo->innerScopeCount;
    if (lVar1 != 0) {
      EnsureLetConstScopeSlots
                (this,*(ParseNodeBlock **)&funcInfo->nextForInLoopLevel,(FuncInfo *)bodyScope);
      EnsureLetConstScopeSlots(this,(ParseNodeBlock *)funcInfo->alloc,(FuncInfo *)bodyScope);
    }
  }
  if (bodyScope[1].scopeType == ~ScopeType_Unknown) {
    bVar4 = ParseNodeFnc::IsBodyAndParamScopeMerged((ParseNodeFnc *)funcInfo);
    if ((bVar4) || (uVar9 = Scope::GetScopeSlotCount(paramScope), uVar9 != 0)) {
      Scope::SetMustInstantiate(paramScope,*(int *)&bodyScope[1].field_0x44 != -1);
      bVar4 = ParseNodeFnc::IsBodyAndParamScopeMerged((ParseNodeFnc *)funcInfo);
      if ((bVar4) &&
         ((funcExprScope != (Scope *)0x0 &&
          (bVar4 = Scope::GetHasNestedParamFunc(funcExprScope), bVar4)))) {
        Scope::SetMustInstantiate(funcExprScope,*(int *)&bodyScope[1].field_0x44 != -1);
      }
    }
  }
  else {
    Scope::SetMustInstantiate(paramScope,true);
  }
  bVar4 = ParseNodeFnc::IsBodyAndParamScopeMerged((ParseNodeFnc *)funcInfo);
  pSVar16 = funcExprScope;
  if (!bVar4) {
    if (bodyScope[1].scopeType == ~ScopeType_Unknown) {
      bVar4 = Scope::GetHasOwnLocalInClosure(funcExprScope);
      Scope::SetMustInstantiate(pSVar16,bVar4);
    }
    else {
      Scope::SetMustInstantiate(funcExprScope,true);
    }
  }
LAB_00b3fe8a:
  PushFuncInfo(this,L"StartEmitFunction",(FuncInfo *)bodyScope);
  bVar4 = FuncInfo::IsBodyAndParamScopeMerged((FuncInfo *)bodyScope);
  if (!bVar4) {
    lVar2 = *(long *)&funcInfo->nextForInLoopLevel;
    if ((*(byte *)(lVar2 + 0x5c) & 3) != 3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf00,"(paramBlock->blockType == Parameter)",
                         "paramBlock->blockType == Parameter");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    PushScope(this,funcExprScope);
    EmitScopeList(this,*(ParseNode **)(lVar2 + 0x38),(ParseNode *)funcInfo->alloc);
    pSVar16 = GetCurrentScope(this);
    if (pSVar16 != funcExprScope) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xf07,"(this->GetCurrentScope() == paramScope)",
                         "this->GetCurrentScope() == paramScope");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
  }
  PushScope(this,paramScope);
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitFunction(ParseNodeFnc *pnodeFnc)
{
    Assert(pnodeFnc->nop == knopFncDecl || pnodeFnc->nop == knopProg);

    FuncInfo *funcInfo = pnodeFnc->funcInfo;
    Scope * const bodyScope = funcInfo->GetBodyScope();
    Scope * const paramScope = funcInfo->GetParamScope();

    if (funcInfo->byteCodeFunction->IsFunctionParsed() && funcInfo->root->pnodeBody != nullptr)
    {
        if (funcInfo->GetParsedFunctionBody()->GetByteCode() == nullptr && !(flags & (fscrEval | fscrImplicitThis)))
        {
            // Only set the environment depth if it's truly known (i.e., not in eval or event handler).
            funcInfo->GetParsedFunctionBody()->SetEnvDepth(this->envDepth);
        }

        if (funcInfo->GetCallsEval())
        {
            funcInfo->byteCodeFunction->SetDontInline(true);
        }

        Scope * const funcExprScope = funcInfo->funcExprScope;
        if (funcExprScope)
        {
            if (funcInfo->GetCallsEval())
            {
                Assert(funcExprScope->GetIsObject());
            }

            if (funcExprScope->GetIsObject())
            {
                funcExprScope->SetCapturesAll(true);
                funcExprScope->SetMustInstantiate(true);
                PushScope(funcExprScope);
            }
            else
            {
                Symbol *sym = funcInfo->root->GetFuncSymbol();
                if (funcInfo->IsBodyAndParamScopeMerged())
                {
                    funcInfo->bodyScope->AddSymbol(sym);
                }
                else
                {
                    funcInfo->paramScope->AddSymbol(sym);
                }
                sym->EnsureScopeSlot(this, funcInfo);
                if (sym->GetHasNonLocalReference())
                {
                    sym->GetScope()->SetHasOwnLocalInClosure(true);
                }
            }
        }

        if (pnodeFnc->nop != knopProg)
        {
            if (!bodyScope->GetIsObject() && NeedObjectAsFunctionScope(funcInfo, pnodeFnc))
            {
                Assert(bodyScope->GetIsObject());
            }

            if (bodyScope->GetIsObject())
            {
                bodyScope->SetLocation(funcInfo->frameObjRegister);
            }
            else
            {
                bodyScope->SetLocation(funcInfo->frameSlotsRegister);
            }

            if (!funcInfo->IsBodyAndParamScopeMerged())
            {
                if (paramScope->GetIsObject())
                {
                    paramScope->SetLocation(funcInfo->frameObjRegister);
                }
                else
                {
                    paramScope->SetLocation(funcInfo->frameSlotsRegister);
                }
            }

            if (bodyScope->GetIsObject())
            {
                // Win8 908700: Disable under F12 debugger because there are too many cached scopes holding onto locals.
                funcInfo->SetHasCachedScope(
                    !PHASE_OFF(Js::CachedScopePhase, funcInfo->byteCodeFunction) &&
                    !funcInfo->Escapes() &&
                    funcInfo->frameObjRegister != Js::Constants::NoRegister &&
                    !ApplyEnclosesArgs(pnodeFnc, this) &&
                    funcInfo->IsBodyAndParamScopeMerged() && // There is eval in the param scope
                    !pnodeFnc->HasDefaultArguments() &&
                    !pnodeFnc->HasDestructuredParams() &&
                    (PHASE_FORCE(Js::CachedScopePhase, funcInfo->byteCodeFunction) || !IsInDebugMode())
#if ENABLE_TTD
                    && !funcInfo->GetParsedFunctionBody()->GetScriptContext()->GetThreadContext()->IsRuntimeInTTDMode()
#endif
                    && !funcInfo->byteCodeFunction->IsCoroutine()
                );

                if (funcInfo->GetHasCachedScope())
                {
                    Assert(funcInfo->funcObjRegister == Js::Constants::NoRegister);
                    Symbol *funcSym = funcInfo->root->GetFuncSymbol();
                    if (funcSym && funcSym->GetIsFuncExpr())
                    {
                        if (funcSym->GetLocation() == Js::Constants::NoRegister)
                        {
                            funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                        }
                        else
                        {
                            funcInfo->funcObjRegister = funcSym->GetLocation();
                        }
                    }
                    else
                    {
                        funcInfo->funcObjRegister = funcInfo->NextVarRegister();
                    }
                    Assert(funcInfo->funcObjRegister != Js::Constants::NoRegister);
                }

                ParseNode *pnode;
                Symbol *sym;

                if (funcInfo->GetHasArguments())
                {
                    // Process function's formal parameters
                    MapFormals(pnodeFnc, [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                        }
                    });

                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });

                    // Only allocate scope slot for "arguments" when really necessary. "hasDeferredChild"
                    // doesn't require scope slot for "arguments" because inner functions can't access
                    // outer function's arguments directly.
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);
                    if (sym->NeedsSlotAlloc(this, funcInfo))
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                sym = funcInfo->root->GetFuncSymbol();

                if (sym && sym->NeedsSlotAlloc(this, funcInfo))
                {
                    if (funcInfo->funcExprScope && funcInfo->funcExprScope->GetIsObject())
                    {
                        sym->SetScopeSlot(0);
                    }
                    else if (funcInfo->GetFuncExprNameReference())
                    {
                        sym->EnsureScopeSlot(this, funcInfo);
                    }
                }

                if (!funcInfo->GetHasArguments())
                {
                    Symbol *formal;
                    Js::ArgSlot pos = 1;
                    auto moveArgToReg = [&](ParseNode *pnode)
                    {
                        if (pnode->IsVarLetOrConst())
                        {
                            formal = pnode->AsParseNodeVar()->sym;
                            // Get the param from its argument position into its assigned register.
                            // The position should match the location; otherwise, it has been shadowed by parameter with the same name.
                            if (formal->GetLocation() + 1 == pos)
                            {
                                pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo);
                            }
                        }
                        pos++;
                    };
                    MapFormals(pnodeFnc, moveArgToReg);
                    MapFormalsFromPattern(pnodeFnc, [&](ParseNode *pnode) { pnode->AsParseNodeVar()->sym->EnsureScopeSlot(this, funcInfo); });
                }

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }
                auto ensureFncDeclScopeSlots = [&](ParseNode *pnodeScope)
                {
                    for (pnode = pnodeScope; pnode;)
                    {
                        switch (pnode->nop)
                        {
                        case knopFncDecl:
                            if (pnode->AsParseNodeFnc()->IsDeclaration())
                            {
                                EnsureFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
                            }
                            pnode = pnode->AsParseNodeFnc()->pnodeNext;
                            break;
                        case knopBlock:
                            pnode = pnode->AsParseNodeBlock()->pnodeNext;
                            break;
                        case knopCatch:
                            pnode = pnode->AsParseNodeCatch()->pnodeNext;
                            break;
                        case knopWith:
                            pnode = pnode->AsParseNodeWith()->pnodeNext;
                            break;
                        }
                    }
                };
                pnodeFnc->MapContainerScopes(ensureFncDeclScopeSlots);

                if (pnodeFnc->pnodeBody)
                {
                    Assert(pnodeFnc->pnodeScopes->nop == knopBlock);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }
            else
            {
                ParseNode *pnode;
                Symbol *sym;

                pnodeFnc->MapContainerScopes([&](ParseNode *pnodeScope) { this->EnsureFncScopeSlots(pnodeScope, funcInfo); });

                for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
                {
                    sym = pnode->AsParseNodeVar()->sym;
                    if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
                    {
                        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                        {
                            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
                        }
                        if (sym->GetSymbolType() == STVariable && sym->NeedsSlotAlloc(this, funcInfo) && !sym->IsArguments())
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                }

                auto ensureScopeSlot = [&](ParseNode *pnode)
                {
                    if (pnode->IsVarLetOrConst())
                    {
                        sym = pnode->AsParseNodeVar()->sym;
                        if (sym->GetSymbolType() == STFormal && sym->NeedsSlotAlloc(this, funcInfo))
                        {
                            sym->EnsureScopeSlot(this, funcInfo);
                        }
                    }
                };
                // Process function's formal parameters
                MapFormals(pnodeFnc, ensureScopeSlot);
                MapFormalsFromPattern(pnodeFnc, ensureScopeSlot);

                if (funcInfo->GetHasArguments())
                {
                    sym = funcInfo->GetArgumentsSymbol();
                    Assert(sym);

                    // There is no eval so the arguments may be captured in a lambda.
                    // But we cannot relay on slots getting allocated while the lambda is emitted as the function body may be reparsed.
                    sym->EnsureScopeSlot(this, funcInfo);
                }

                if (pnodeFnc->pnodeBody)
                {
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeScopes, funcInfo);
                    this->EnsureLetConstScopeSlots(pnodeFnc->pnodeBodyScope, funcInfo);
                }
            }

            // When we have split scope and body scope does not have any scope slots allocated, we don't have to mark the body scope as mustinstantiate.
            if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
            {
                bodyScope->SetMustInstantiate(true);
            }
            else if (pnodeFnc->IsBodyAndParamScopeMerged() || bodyScope->GetScopeSlotCount() != 0)
            {
                bodyScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);

                if (pnodeFnc->IsBodyAndParamScopeMerged() && paramScope && paramScope->GetHasNestedParamFunc())
                {
                    paramScope->SetMustInstantiate(funcInfo->frameSlotsRegister != Js::Constants::NoRegister);
                }
            }

            if (!pnodeFnc->IsBodyAndParamScopeMerged())
            {
                if (funcInfo->frameObjRegister != Js::Constants::NoRegister)
                {
                    paramScope->SetMustInstantiate(true);
                }
                else
                {
                    // In the case of function expression being captured in the param scope the hasownlocalinclosure will be false for param scope,
                    // as function expression symbol stays in the function expression scope. We don't have to set mustinstantiate for param scope in that case.
                    paramScope->SetMustInstantiate(paramScope->GetHasOwnLocalInClosure());
                }
            }
        }
        else
        {
            bool newScopeForEval = (funcInfo->byteCodeFunction->GetIsStrictMode() && (this->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                Assert(bodyScope->GetIsObject());
            }
        }
    }

    PushFuncInfo(_u("StartEmitFunction"), funcInfo);

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        ParseNodeBlock * paramBlock = pnodeFnc->pnodeScopes;
        Assert(paramBlock->blockType == Parameter);

        PushScope(paramScope);

        // While emitting the functions we have to stop when we see the body scope block.
        // Otherwise functions defined in the body scope will not be able to get the right references.
        this->EmitScopeList(paramBlock->pnodeScopes, pnodeFnc->pnodeBodyScope);
        Assert(this->GetCurrentScope() == paramScope);
    }

    PushScope(bodyScope);
}